

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

fixed_t tmvline1_revsubclamp(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  BYTE *pBVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  
  iVar6 = tmvlinebits;
  pBVar5 = dc_source;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  lVar10 = (long)dc_pitch;
  pbVar9 = dc_dest;
  uVar7 = dc_texturefrac;
  iVar8 = dc_count;
  do {
    if ((ulong)pBVar5[uVar7 >> ((byte)iVar6 & 0x3f)] != 0) {
      uVar11 = (pDVar4[*pbVar9] | 0x40100400) -
               pDVar3[plVar1[pBVar5[uVar7 >> ((byte)iVar6 & 0x3f)]]];
      uVar12 = uVar11 & 0x40100400;
      uVar11 = uVar12 - (uVar12 >> 5) & uVar11 | 0x1f07c1f;
      *pbVar9 = RGB32k.All[uVar11 >> 0xf & uVar11];
    }
    uVar7 = uVar7 + fVar2;
    pbVar9 = pbVar9 + lVar10;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  return uVar7;
}

Assistant:

fixed_t tmvline1_revsubclamp ()
{
	DWORD fracstep = dc_iscale;
	DWORD frac = dc_texturefrac;
	BYTE *colormap = dc_colormap;
	int count = dc_count;
	const BYTE *source = dc_source;
	BYTE *dest = dc_dest;
	int bits = tmvlinebits;
	int pitch = dc_pitch;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		BYTE pix = source[frac>>bits];
		if (pix != 0)
		{
			DWORD a = (bg2rgb[*dest] | 0x40100400) - fg2rgb[colormap[pix]];
			DWORD b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[a & (a>>15)];
		}
		frac += fracstep;
		dest += pitch;
	} while (--count);

	return frac;
}